

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  bool bVar1;
  reference ppNVar2;
  reference ppNVar3;
  Edge *this_00;
  pointer ppVar4;
  byte local_111;
  _Self local_d8;
  _Self local_d0;
  iterator want_e;
  Edge *edge;
  Edge *in_edge;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_b0;
  iterator v;
  undefined1 local_a0 [8];
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  Node *n;
  _Self local_78;
  iterator i;
  undefined1 local_60 [8];
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  string *err_local;
  Node *node_local;
  DependencyScan *scan_local;
  Plan *this_local;
  
  dependents._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  local_78._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
                 ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  while( true ) {
    n = (Node *)std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end
                          ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
    bVar1 = std::operator!=(&local_78,(_Self *)&n);
    if (!bVar1) break;
    ppNVar2 = std::_Rb_tree_const_iterator<Node_*>::operator*(&local_78);
    validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppNVar2;
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_a0);
    bVar1 = DependencyScan::RecomputeDirty
                      (scan,(Node *)validation_nodes.
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                       (vector<Node_*,_std::allocator<Node_*>_> *)local_a0,
                       (string *)dependents._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) {
      local_b0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)local_a0);
      while( true ) {
        in_edge = (Edge *)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                    ((vector<Node_*,_std::allocator<Node_*>_> *)local_a0);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b0,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)&in_edge);
        if (!bVar1) break;
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_b0);
        this_00 = Node::in_edge(*ppNVar3);
        if ((this_00 != (Edge *)0x0) && (bVar1 = Edge::outputs_ready(this_00), !bVar1)) {
          ppNVar3 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_b0);
          bVar1 = AddTarget(this,*ppNVar3,
                            (string *)dependents._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (!bVar1) {
            this_local._7_1_ = 0;
            v._M_current._4_4_ = 1;
            goto LAB_001102bb;
          }
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_b0);
      }
      bVar1 = Node::dirty((Node *)validation_nodes.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        want_e._M_node =
             (_Base_ptr)
             Node::in_edge((Node *)validation_nodes.
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
        local_111 = 0;
        if ((Edge *)want_e._M_node != (Edge *)0x0) {
          bVar1 = Edge::outputs_ready((Edge *)want_e._M_node);
          local_111 = bVar1 ^ 0xff;
        }
        if ((local_111 & 1) == 0) {
          __assert_fail("edge && !edge->outputs_ready()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                        ,0x19f,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        local_d0._M_node =
             (_Base_ptr)
             std::
             map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
             ::find(&this->want_,(key_type *)&want_e);
        local_d8._M_node =
             (_Base_ptr)
             std::
             map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
             ::end(&this->want_);
        bVar1 = std::operator!=(&local_d0,&local_d8);
        if (!bVar1) {
          __assert_fail("want_e != want_.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                        ,0x1a1,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        ppVar4 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_d0);
        if (ppVar4->second == kWantNothing) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                             (&local_d0);
          ppVar4->second = kWantToStart;
          EdgeWanted(this,(Edge *)want_e._M_node);
        }
        v._M_current._4_4_ = 0;
      }
      else {
        v._M_current._4_4_ = 4;
      }
    }
    else {
      this_local._7_1_ = 0;
      v._M_current._4_4_ = 1;
    }
LAB_001102bb:
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_a0);
    if ((v._M_current._4_4_ != 0) && (v._M_current._4_4_ != 4)) goto LAB_00110304;
    std::_Rb_tree_const_iterator<Node_*>::operator++(&local_78);
  }
  this_local._7_1_ = 1;
  v._M_current._4_4_ = 1;
LAB_00110304:
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::~set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    std::vector<Node*> validation_nodes;
    if (!scan->RecomputeDirty(n, &validation_nodes, err))
      return false;

    // Add any validation nodes found during RecomputeDirty as new top level
    // targets.
    for (std::vector<Node*>::iterator v = validation_nodes.begin();
         v != validation_nodes.end(); ++v) {
      if (Edge* in_edge = (*v)->in_edge()) {
        if (!in_edge->outputs_ready() &&
            !AddTarget(*v, err)) {
          return false;
        }
      }
    }
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}